

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

void __thiscall
Centaurus::CATNMachine<unsigned_char>::print
          (CATNMachine<unsigned_char> *this,wostream *os,wstring *name)

{
  wostream *pwVar1;
  size_type sVar2;
  const_reference this_00;
  uint local_24;
  uint i;
  wstring *name_local;
  wostream *os_local;
  CATNMachine<unsigned_char> *this_local;
  
  pwVar1 = std::operator<<(os,L"digraph ");
  pwVar1 = std::operator<<(pwVar1,(wstring *)name);
  pwVar1 = std::operator<<(pwVar1,L" {");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"rankdir=\"LR\";");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"graph [ charset=\"UTF-8\" ];");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"node [ style=\"solid,filled\" ];");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar1 = std::operator<<(os,L"edge [ style=\"solid\" ];");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
            ::size(&this->m_nodes);
    if (sVar2 <= local_24) break;
    this_00 = std::
              vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
              ::operator[](&this->m_nodes,(ulong)local_24);
    CATNNode<unsigned_char>::print(this_00,os,local_24);
    local_24 = local_24 + 1;
  }
  pwVar1 = std::operator<<(os,L"}");
  std::wostream::operator<<(pwVar1,std::endl<wchar_t,std::char_traits<wchar_t>>);
  return;
}

Assistant:

void print(std::wostream& os, const std::wstring& name) const
	{
		os << L"digraph " << name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		for (unsigned int i = 0; i < m_nodes.size(); i++)
		{
			m_nodes[i].print(os, i);
		}

		os << L"}" << std::endl;
	}